

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_CallExprPrecedence_Test::TestBody(ExprWriterTest_CallExprPrecedence_Test *this)

{
  ExprFactory *this_00;
  Reference lhs;
  Reference arg;
  Function func;
  ExprBase rhs;
  char *message;
  StringRef name;
  AssertHelper local_e0;
  AssertionResult gtest_ar;
  string local_c8;
  Expr args [4];
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> local_88;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> local_58;
  
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory;
  lhs = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(this_00,0);
  arg = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(this_00,1);
  name.size_ = 3;
  name.data_ = "foo";
  func = mp::BasicExprFactory<std::allocator<char>_>::AddFunction(this_00,name,-1,NUMERIC);
  local_58.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.data_ = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)0x0;
  local_58.size_ = 0;
  args[0].super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeCall(&this->super_ExprWriterTest,func,&local_58);
  rhs.impl_ = (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,5.0);
  args[1].super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,ADD,
                  (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                  lhs.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_,
                  (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)rhs.impl_);
  args[2].super_ExprBase.impl_ =
       (ExprBase)mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,7.0);
  args[3].super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeUnary<mp::BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,FLOOR,
                  (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                  arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_);
  std::
  _Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
  ::~_Vector_base((_Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
                   *)&local_58);
  local_88.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.size_ = 4;
  local_88.data_ = args;
  local_e0.data_ =
       (AssertHelperData *)ExprWriterTest::MakeCall(&this->super_ExprWriterTest,func,&local_88);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_c8,(fmt *)0x14e4d3,(CStringRef)&local_e0,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)rhs.impl_);
  testing::internal::CmpHelperEQ<char[33],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"foo(foo(), x1 + 5, 7, floor(x2))\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeCall(f, args)))",
             (char (*) [33])"foo(foo(), x1 + 5, 7, floor(x2))",&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::
  _Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
  ::~_Vector_base((_Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>_>
                   *)&local_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_c8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x22e,message);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_c8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ExprWriterTest, CallExprPrecedence) {
  auto x1 = MakeVariable(0), x2 = MakeVariable(1);
  auto f = AddFunction("foo", -1);
  mp::Expr args[] = {
      MakeCall(f, mp::MakeArrayRef<mp::Expr>(0, 0)),
      MakeBinary(ex::ADD, x1, MakeConst(5)),
      MakeConst(7),
      MakeUnary(ex::FLOOR, x2)
  };
  CHECK_WRITE("foo(foo(), x1 + 5, 7, floor(x2))", MakeCall(f, args));
}